

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O0

void __thiscall CGL::SceneObjects::Triangle::draw(Triangle *this,Color *c,float alpha)

{
  undefined4 *in_RSI;
  long in_RDI;
  undefined4 in_XMM0_Da;
  
  glColor4f(*in_RSI,in_RSI[1],in_RSI[2],in_XMM0_Da);
  glBegin(4);
  glVertex3d(*(undefined8 *)(in_RDI + 0x10),*(undefined8 *)(in_RDI + 0x18),
             *(undefined8 *)(in_RDI + 0x20));
  glVertex3d(*(undefined8 *)(in_RDI + 0x30),*(undefined8 *)(in_RDI + 0x38),
             *(undefined8 *)(in_RDI + 0x40));
  glVertex3d(*(undefined8 *)(in_RDI + 0x50),*(undefined8 *)(in_RDI + 0x58),
             *(undefined8 *)(in_RDI + 0x60));
  glEnd();
  return;
}

Assistant:

void Triangle::draw(const Color &c, float alpha) const {
  glColor4f(c.r, c.g, c.b, alpha);
  glBegin(GL_TRIANGLES);
  glVertex3d(p1.x, p1.y, p1.z);
  glVertex3d(p2.x, p2.y, p2.z);
  glVertex3d(p3.x, p3.y, p3.z);
  glEnd();
}